

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

void Aig_TableResize(Aig_Man_t *p)

{
  Aig_Obj_t **__ptr;
  int iVar1;
  int iVar2;
  Aig_Obj_t **ppAVar3;
  Aig_Obj_t *local_58;
  Aig_Obj_t *local_50;
  abctime clk;
  int local_38;
  int i;
  int Counter;
  int nTableSizeOld;
  Aig_Obj_t **ppPlace;
  Aig_Obj_t **pTableOld;
  Aig_Obj_t *pNext;
  Aig_Obj_t *pEntry;
  Aig_Man_t *p_local;
  
  if (p->pTable == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x4b,"void Aig_TableResize(Aig_Man_t *)");
  }
  Abc_Clock();
  __ptr = p->pTable;
  iVar2 = p->nTableSize;
  iVar1 = Aig_ManNodeNum(p);
  iVar1 = Abc_PrimeCudd(iVar1 << 1);
  p->nTableSize = iVar1;
  ppAVar3 = (Aig_Obj_t **)malloc((long)p->nTableSize << 3);
  p->pTable = ppAVar3;
  memset(p->pTable,0,(long)p->nTableSize << 3);
  local_38 = 0;
  clk._4_4_ = 0;
  do {
    if (iVar2 <= clk._4_4_) {
      iVar2 = Aig_ManNodeNum(p);
      if (local_38 != iVar2) {
        __assert_fail("Counter == Aig_ManNodeNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                      ,0x62,"void Aig_TableResize(Aig_Man_t *)");
      }
      if (__ptr != (Aig_Obj_t **)0x0) {
        free(__ptr);
      }
      return;
    }
    pNext = __ptr[clk._4_4_];
    if (pNext == (Aig_Obj_t *)0x0) {
      local_50 = (Aig_Obj_t *)0x0;
    }
    else {
      local_50 = (pNext->field_0).pNext;
    }
    pTableOld = (Aig_Obj_t **)local_50;
    while (pNext != (Aig_Obj_t *)0x0) {
      ppAVar3 = Aig_TableFind(p,pNext);
      if (*ppAVar3 != (Aig_Obj_t *)0x0) {
        __assert_fail("*ppPlace == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                      ,0x5c,"void Aig_TableResize(Aig_Man_t *)");
      }
      *ppAVar3 = pNext;
      (pNext->field_0).pNext = (Aig_Obj_t *)0x0;
      local_38 = local_38 + 1;
      pNext = (Aig_Obj_t *)pTableOld;
      if (pTableOld == (Aig_Obj_t **)0x0) {
        local_58 = (Aig_Obj_t *)0x0;
      }
      else {
        local_58 = *pTableOld;
      }
      pTableOld = (Aig_Obj_t **)local_58;
    }
    clk._4_4_ = clk._4_4_ + 1;
  } while( true );
}

Assistant:

void Aig_TableResize( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry, * pNext;
    Aig_Obj_t ** pTableOld, ** ppPlace;
    int nTableSizeOld, Counter, i;
    abctime clk;
    assert( p->pTable != NULL );
clk = Abc_Clock();
    // save the old table
    pTableOld = p->pTable;
    nTableSizeOld = p->nTableSize;
    // get the new table
    p->nTableSize = Abc_PrimeCudd( 2 * Aig_ManNodeNum(p) ); 
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nTableSizeOld; i++ )
    for ( pEntry = pTableOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the table 
        ppPlace = Aig_TableFind( p, pEntry );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == Aig_ManNodeNum(p) );
//    printf( "Increasing the structural table size from %6d to %6d. ", nTableSizeOld, p->nTableSize );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( pTableOld );
}